

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  int local_10 [2];
  int choice;
  
  local_10[1] = 0;
  local_10[0] = 0;
  this = std::operator<<((ostream *)&std::cout,
                         "Welcome! Please choose one of the various algorithms implemented:");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  while (local_10[0] != 5) {
    std::operator<<((ostream *)&std::cout,"1. DFS \n 2. BFS \n 3. Best First Search \n 4. A* \n");
    std::istream::operator>>((istream *)&std::cin,local_10);
    if (local_10[0] == 1) {
      DFS();
    }
    else if (local_10[0] == 2) {
      BFS();
    }
    else if (local_10[0] == 3) {
      BestFirst();
    }
    else if (local_10[0] == 4) {
      Astar();
    }
  }
  return 0;
}

Assistant:

int main() {
    int choice = 0;
    std::cout << "Welcome! Please choose one of the various algorithms implemented:" << std::endl;
    while (choice != 5) {
        std::cout << "1. DFS \n 2. BFS \n 3. Best First Search \n 4. A* \n";
        std::cin >> choice;
        if (choice == 1) {
            DFS();
        } else if (choice == 2) {
            BFS();
        } else if (choice == 3) {
            BestFirst();
        } else if (choice == 4) {
            Astar();
        }
    }
    return 0;
}